

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

void proto2_unittest::AggregateMessageSetElement::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  AggregateMessageSetElement *this;
  MessageLite *value;
  AggregateMessageSetElement **v1;
  AggregateMessageSetElement **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  Arena *arena;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  AggregateMessageSetElement *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  AggregateMessageSetElement *from;
  AggregateMessageSetElement *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  AggregateMessageSetElement *local_18;
  anon_union_16_1_493b367e_for_AggregateMessageSetElement_5 *local_10;
  
  local_50 = (AggregateMessageSetElement *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (AggregateMessageSetElement *)to_msg;
  _this = (AggregateMessageSetElement *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::AggregateMessageSetElement_const*>(&local_50);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::AggregateMessageSetElement*>(&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::AggregateMessageSetElement_const*,proto2_unittest::AggregateMessageSetElement*>
                       (v1,v2,"&from != _this");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_custom_options.pb.cc"
               ,0x1605,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
  this = from;
  uVar1 = *puVar3;
  if ((uVar1 & 1) != 0) {
    to_msg_local = (MessageLite *)
                   _internal_s_abi_cxx11_
                             ((AggregateMessageSetElement *)absl_log_internal_check_op_result);
    local_18 = this;
    local_10 = &this->field_0;
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(this->field_0)._impl_._has_bits_,0);
    value = to_msg_local;
    *puVar3 = *puVar3 | 1;
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    google::protobuf::internal::ArenaStringPtr::Set<>
              (&(this->field_0)._impl_.s_,(string *)value,arena);
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void AggregateMessageSetElement::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<AggregateMessageSetElement*>(&to_msg);
  auto& from = static_cast<const AggregateMessageSetElement&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.AggregateMessageSetElement)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_internal_set_s(from._internal_s());
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}